

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void luaC_fullgc(lua_State *L,int isemergency)

{
  global_State *g_00;
  undefined1 auVar1 [16];
  GCObject **p;
  ulong uVar2;
  long lVar3;
  global_State *g;
  ulong uVar4;
  GCObject **old;
  
  g_00 = L->l_G;
  g_00->gcemergency = (lu_byte)isemergency;
  if (g_00->gckind == '\0') {
    if (g_00->gcstate < 3) {
      g_00->gcstate = '\x03';
      p = &g_00->allgc;
      do {
        p = sweeplist(L,p,1,(int *)0x0);
      } while (p == &g_00->allgc);
      g_00->sweepgc = p;
    }
    luaC_runtilstate(L,0x100);
    luaC_runtilstate(L,0x80);
    luaC_runtilstate(L,0x100);
    uVar4 = (ulong)g_00->gcpause * 4;
    uVar2 = g_00->GCestimate / 100;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    lVar3 = uVar2 * uVar4;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar1,0) <= uVar4) {
      lVar3 = 0x7fffffffffffffff;
    }
    uVar2 = (g_00->GCdebt + g_00->totalbytes) - lVar3;
    luaE_setdebt(g_00,(long)uVar2 >> 0x3f & uVar2);
  }
  else {
    enterinc(g_00);
    entergen(L,g_00);
  }
  g_00->gcemergency = '\0';
  return;
}

Assistant:

void luaC_fullgc (lua_State *L, int isemergency) {
  global_State *g = G(L);
  lua_assert(!g->gcemergency);
  g->gcemergency = isemergency;  /* set flag */
  if (g->gckind == KGC_INC)
    fullinc(L, g);
  else
    fullgen(L, g);
  g->gcemergency = 0;
}